

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O3

TextureCube *
glu::TextureCube::create
          (RenderContext *context,ContextInfo *contextInfo,Archive *archive,int numLevels,
          char **filenames)

{
  uint uVar1;
  int iVar2;
  TextureCube *this;
  TestError *this_00;
  long lVar3;
  vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> levels;
  string ext;
  TexDecompressionParams local_7c;
  undefined1 local_78 [32];
  ulong local_58;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,*filenames,(allocator<char> *)&local_7c);
  de::FilePath::getFileExtension_abi_cxx11_(&local_50,(FilePath *)local_78);
  if ((CompressedTexture *)local_78._0_8_ != (CompressedTexture *)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_,(ulong)((long)(CompressedTexFormat *)local_78._16_8_ + 1)
                   );
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar2 == 0) {
    uVar1 = numLevels * 6;
    local_58 = (ulong)(uint)numLevels;
    std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::vector
              ((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)local_78,
               (long)(int)uVar1,(allocator_type *)&local_7c);
    if (0 < (int)uVar1) {
      lVar3 = 0;
      do {
        tcu::ImageIO::loadPKM
                  ((CompressedTexture *)((long)(CompressedTexFormat *)local_78._0_8_ + lVar3),
                   archive,*filenames);
        lVar3 = lVar3 + 0x28;
        filenames = filenames + 1;
      } while ((ulong)uVar1 * 0x28 != lVar3);
    }
    this = (TextureCube *)operator_new(0x180);
    local_7c.astcMode = ASTCMODE_LAST;
    TextureCube(this,context,contextInfo,(int)local_58,(CompressedTexture *)local_78._0_8_,&local_7c
               );
    std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::~vector
              ((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return this;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unsupported file format",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x1ca);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TextureCube* TextureCube::create (const RenderContext& context, const ContextInfo& contextInfo, const tcu::Archive& archive, int numLevels, const char* const* filenames)
{
	DE_ASSERT(numLevels > 0);

	std::string ext = de::FilePath(filenames[0]).getFileExtension();

	// \todo [2011-11-21 pyry] Support PNG images.
	if (ext == "pkm")
	{
		// Compressed texture.
		int								numImages	= numLevels*tcu::CUBEFACE_LAST;
		vector<tcu::CompressedTexture>	levels		(numImages);

		for (int ndx = 0; ndx < numImages; ndx++)
			tcu::ImageIO::loadPKM(levels[ndx], archive, filenames[ndx]);

		return new TextureCube(context, contextInfo, numLevels, &levels[0]);
	}
	else
		TCU_FAIL("Unsupported file format");
}